

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall ON_SerialNumberMap::AddSerialNumber(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  uint uVar1;
  ON_SN_BLOCK *pOVar2;
  ON__UINT64 OVar3;
  ON_SerialNumberMap *local_28;
  SN_ELEMENT *e;
  ON__UINT64 sn_local;
  ON_SerialNumberMap *this_local;
  
  if (sn == 0) {
    this_local = (ON_SerialNumberMap *)0x0;
  }
  else {
    local_28 = (ON_SerialNumberMap *)FindElementHelper(this,sn);
    if (local_28 == (ON_SerialNumberMap *)0x0) {
      if (this->m_sn_block0->m_count == 0x2000) {
        GarbageCollectHelper(this);
      }
      if (this->m_sn_block0->m_count == 0) {
        this->m_sn_block0->m_sn1 = sn;
        this->m_sn_block0->m_sn0 = sn;
        this->m_sn_block0->m_sorted = 1;
      }
      else if (this->m_sn_block0->m_sn1 < sn) {
        this->m_sn_block0->m_sn1 = sn;
      }
      else {
        if (sn < this->m_sn_block0->m_sn0) {
          this->m_sn_block0->m_sn0 = sn;
        }
        this->m_sn_block0->m_sorted = 0;
      }
      OVar3 = ON_SerialNumberMapPrivate::MaxSn(this->m_private);
      if (OVar3 < sn) {
        ON_SerialNumberMapPrivate::SetMaxSn(this->m_private,sn);
      }
      if ((sn < 0xffffffff) &&
         (OVar3 = ON_SerialNumberMapPrivate::LowerMaxSn(this->m_private), OVar3 < sn)) {
        ON_SerialNumberMapPrivate::SetLowerMaxSn(this->m_private,sn);
      }
      this->m_sn_count = this->m_sn_count + 1;
      pOVar2 = this->m_sn_block0;
      uVar1 = this->m_sn_block0->m_count;
      this->m_sn_block0->m_count = uVar1 + 1;
      local_28 = (ON_SerialNumberMap *)(pOVar2->m_sn + uVar1);
      memset(local_28,0,0x38);
      local_28->m_sn_purged = sn;
      *(ON__UINT8 *)&local_28->m_snblk_list_capacity = '\x01';
    }
    else if ((ON__UINT8)local_28->m_snblk_list_capacity == '\0') {
      this->m_sn_purged = this->m_sn_purged - 1;
      this->m_e_blk->m_purged = this->m_e_blk->m_purged - 1;
      memset(local_28,0,0x38);
      local_28->m_sn_purged = sn;
      *(ON__UINT8 *)&local_28->m_snblk_list_capacity = '\x01';
    }
    this_local = local_28;
  }
  return (SN_ELEMENT *)this_local;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::AddSerialNumber(ON__UINT64 sn)
{
  if ( sn <= 0 )
    return 0;
  struct SN_ELEMENT* e = FindElementHelper(sn);
  if ( e )
  {
    if ( 0 == e->m_sn_active )
    {
      m_sn_purged--;
      m_e_blk->m_purged--;
      memset(e,0,sizeof(*e));
      e->m_sn = sn;
      e->m_sn_active = 1;
    }
  }
  else
  {
    if ( ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count )
    {
      // make room in m_sn_block0 for the new serial number
      GarbageCollectHelper();    
    }

    if ( 0 == m_sn_block0.m_count )
    {
      m_sn_block0.m_sn0 = m_sn_block0.m_sn1 = sn;
      m_sn_block0.m_sorted = 1;
    }
    else
    {
      if ( sn > m_sn_block0.m_sn1 )
      {
        m_sn_block0.m_sn1 = sn;
      }
      else
      {
        if ( sn < m_sn_block0.m_sn0 )
          m_sn_block0.m_sn0 = sn;
        m_sn_block0.m_sorted = 0;
      }        
    }
    if ( sn > m_private->MaxSn() )
      m_private->SetMaxSn(sn);
    if (sn < UINT32_MAX && sn > m_private->LowerMaxSn())
      m_private->SetLowerMaxSn(sn);

    m_sn_count++;
    e = &m_sn_block0.m_sn[m_sn_block0.m_count++];
    memset(e,0,sizeof(*e));
    e->m_sn = sn;
    e->m_sn_active = 1;
  }

  return e;
}